

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,format_object_base *Fmt)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  pointer pcVar4;
  char *__buf;
  raw_ostream *prVar5;
  char *__n;
  size_t BytesUsed_1;
  undefined1 local_c8 [8];
  SmallVector<char,_128U> V;
  size_t BytesUsed;
  size_t BufferBytesLeft;
  size_t NextBufferSize;
  format_object_base *Fmt_local;
  raw_ostream *this_local;
  
  BufferBytesLeft = 0x7f;
  __n = this->OutBufCur;
  uVar3 = (long)this->OutBufEnd - (long)__n;
  if (3 < uVar3) {
    uVar2 = format_object_base::print(Fmt,this->OutBufCur,(uint)uVar3);
    V.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ = ZEXT48(uVar2);
    BufferBytesLeft = V.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_;
    if ((ulong)V.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ <= uVar3) {
      this->OutBufCur = this->OutBufCur + V.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_;
      return this;
    }
  }
  SmallVector<char,_128U>::SmallVector((SmallVector<char,_128U> *)local_c8);
  do {
    SmallVectorImpl<char>::resize((SmallVectorImpl<char> *)local_c8,BufferBytesLeft);
    pcVar4 = SmallVectorTemplateCommon<char,_void>::data
                       ((SmallVectorTemplateCommon<char,_void> *)local_c8);
    uVar2 = format_object_base::print(Fmt,pcVar4,(uint)BufferBytesLeft);
    __buf = (char *)(ulong)uVar2;
    if (__buf <= BufferBytesLeft) {
      pcVar4 = SmallVectorTemplateCommon<char,_void>::data
                         ((SmallVectorTemplateCommon<char,_void> *)local_c8);
      prVar5 = (raw_ostream *)write(this,(int)pcVar4,__buf,(size_t)__n);
      SmallVector<char,_128U>::~SmallVector((SmallVector<char,_128U> *)local_c8);
      return prVar5;
    }
    bVar1 = BufferBytesLeft < __buf;
    __n = __buf;
    BufferBytesLeft = (size_t)__buf;
  } while (bVar1);
  __assert_fail("BytesUsed > NextBufferSize && \"Didn\'t grow buffer!?\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                ,0x157,"raw_ostream &llvm::raw_ostream::operator<<(const format_object_base &)");
}

Assistant:

raw_ostream &raw_ostream::operator<<(const format_object_base &Fmt) {
  // If we have more than a few bytes left in our output buffer, try
  // formatting directly onto its end.
  size_t NextBufferSize = 127;
  size_t BufferBytesLeft = OutBufEnd - OutBufCur;
  if (BufferBytesLeft > 3) {
    size_t BytesUsed = Fmt.print(OutBufCur, BufferBytesLeft);

    // Common case is that we have plenty of space.
    if (BytesUsed <= BufferBytesLeft) {
      OutBufCur += BytesUsed;
      return *this;
    }

    // Otherwise, we overflowed and the return value tells us the size to try
    // again with.
    NextBufferSize = BytesUsed;
  }

  // If we got here, we didn't have enough space in the output buffer for the
  // string.  Try printing into a SmallVector that is resized to have enough
  // space.  Iterate until we win.
  SmallVector<char, 128> V;

  while (true) {
    V.resize(NextBufferSize);

    // Try formatting into the SmallVector.
    size_t BytesUsed = Fmt.print(V.data(), NextBufferSize);

    // If BytesUsed fit into the vector, we win.
    if (BytesUsed <= NextBufferSize)
      return write(V.data(), BytesUsed);

    // Otherwise, try again with a new size.
    assert(BytesUsed > NextBufferSize && "Didn't grow buffer!?");
    NextBufferSize = BytesUsed;
  }
}